

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

string * centerOut(string *__return_storage_ptr__,string *str,int width)

{
  ostream *poVar1;
  int i;
  int iVar2;
  uint uVar3;
  string local_380 [32];
  string local_360 [32];
  stringstream spaces;
  ostream local_330 [376];
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::__cxx11::stringstream::stringstream((stringstream *)&spaces);
  uVar3 = width - (int)str->_M_string_length;
  for (iVar2 = 0; iVar2 < (int)uVar3 / 2; iVar2 = iVar2 + 1) {
    std::operator<<(local_330," ");
  }
  std::__cxx11::stringbuf::str();
  poVar1 = std::operator<<(local_1a8,local_360);
  poVar1 = std::operator<<(poVar1,(string *)str);
  std::__cxx11::stringbuf::str();
  std::operator<<(poVar1,local_380);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_360);
  if ((uVar3 & 1) != 0 && 0 < (int)uVar3) {
    std::operator<<(local_1a8," ");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&spaces);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string centerOut(const string& str, const int width) {
    stringstream ss, spaces;
    int padding = width - int(str.size());
    for (int i = 0; i < padding / 2; ++i)
        spaces << " ";
    ss << spaces.str() << str << spaces.str();
    if (padding > 0 && padding % 2 != 0)
        ss << " ";
    return ss.str();
}